

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

bstring bfromcstr(char *str)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  size_t j;
  int i;
  bstring b;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    sVar3 = strlen(str);
    iVar1 = (int)sVar3;
    iVar2 = snapUpSize(iVar1 + (2 - (uint)(sVar3 != 0)));
    if (iVar1 < iVar2) {
      str_local = (char *)malloc(0x10);
      if ((int *)str_local == (int *)0x0) {
        str_local = (char *)0x0;
      }
      else {
        *(int *)((long)str_local + 4) = iVar1;
        *(int *)str_local = iVar2;
        pvVar4 = malloc((long)iVar2);
        *(void **)((long)str_local + 8) = pvVar4;
        if (pvVar4 == (void *)0x0) {
          free(str_local);
          str_local = (char *)0x0;
        }
        else {
          memcpy(*(void **)((long)str_local + 8),str,sVar3 + 1);
        }
      }
    }
    else {
      str_local = (char *)0x0;
    }
  }
  return (bstring)str_local;
}

Assistant:

bstring bfromcstr (const char * str) {
bstring b;
int i;
size_t j;

	if (str == NULL) return NULL;
	j = (strlen) (str);
	i = snapUpSize ((int) (j + (2 - (j != 0))));
	if (i <= (int) j) return NULL;

	b = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (NULL == b) return NULL;
	b->slen = (int) j;
	if (NULL == (b->data = (unsigned char *) bstr__alloc (b->mlen = i))) {
		bstr__free (b);
		return NULL;
	}

	bstr__memcpy (b->data, str, j+1);
	return b;
}